

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O2

ma_uint32 ma_pcm_rb_available_write(ma_pcm_rb *pRB)

{
  ma_uint32 mVar1;
  
  if (pRB != (ma_pcm_rb *)0x0) {
    mVar1 = ma_rb_available_write(&pRB->rb);
    return mVar1 / (*(int *)(&DAT_00176420 + (ulong)pRB->format * 4) * pRB->channels);
  }
  return 0;
}

Assistant:

MA_API ma_uint32 ma_pcm_rb_available_write(ma_pcm_rb* pRB)
{
    if (pRB == NULL) {
        return 0;
    }

    return ma_rb_available_write(&pRB->rb) / ma_pcm_rb_get_bpf(pRB);
}